

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O1

void WebRtcIsac_Lar2Poly(double *lars,double *lowband,int orderLo,double *hiband,int orderHi,
                        int Nsub)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  double rc [100];
  double *local_388;
  double local_358 [101];
  
  if (0 < Nsub) {
    iVar1 = orderLo + 2 + orderHi;
    pdVar2 = lars + (orderLo + 2);
    iVar4 = 0;
    local_388 = lowband;
    do {
      if (0 < orderLo) {
        uVar3 = 0;
        do {
          dVar5 = exp(lars[uVar3 + 2]);
          local_358[uVar3] = (dVar5 + -1.0) / (dVar5 + 1.0);
          uVar3 = uVar3 + 1;
        } while ((uint)orderLo != uVar3);
      }
      WebRtcIsac_Rc2Poly(local_358,orderLo,local_388);
      if (0 < orderHi) {
        uVar3 = 0;
        do {
          dVar5 = exp(pdVar2[uVar3]);
          local_358[uVar3] = (dVar5 + -1.0) / (dVar5 + 1.0);
          uVar3 = uVar3 + 1;
        } while ((uint)orderHi != uVar3);
      }
      WebRtcIsac_Rc2Poly(local_358,orderHi,hiband);
      *local_388 = *lars;
      *hiband = lars[1];
      local_388 = local_388 + (orderLo + 1);
      hiband = hiband + (orderHi + 1);
      lars = lars + iVar1;
      iVar4 = iVar4 + 1;
      pdVar2 = pdVar2 + iVar1;
    } while (iVar4 != Nsub);
  }
  return;
}

Assistant:

void WebRtcIsac_Lar2Poly(double* lars, double* lowband, int orderLo,
                         double* hiband, int orderHi, int Nsub) {
  int k, orderTot;
  double rc[MAX_ORDER], *outpl, *outph, *inp;

  orderTot = (orderLo + orderHi + 2);
  outpl = lowband;
  outph = hiband;
  /* First two elements of 'inp' store gains*/
  inp = lars;
  for (k = 0; k < Nsub; k++) {
    /* Low band */
    WebRtcIsac_Lar2Rc(&inp[2], rc, orderLo);
    WebRtcIsac_Rc2Poly(rc, orderLo, outpl);

    /* High band */
    WebRtcIsac_Lar2Rc(&inp[orderLo + 2], rc, orderHi);
    WebRtcIsac_Rc2Poly(rc, orderHi, outph);

    /* gains */
    outpl[0] = inp[0];
    outph[0] = inp[1];

    outpl += orderLo + 1;
    outph += orderHi + 1;
    inp += orderTot;
  }
}